

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::getIndex(PrimitiveRestartCase *this,int indexNdx)

{
  IndexType IVar1;
  byte *pbVar2;
  reference pvVar3;
  reference pvVar4;
  int indexNdx_local;
  PrimitiveRestartCase *this_local;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_indicesUB,(long)indexNdx);
    this_local._4_4_ = (uint)*pbVar2;
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->m_indicesUS,(long)indexNdx);
    this_local._4_4_ = (uint)*pvVar3;
  }
  else if (IVar1 == INDEX_UNSIGNED_INT) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_indicesUI,(long)indexNdx);
    this_local._4_4_ = *pvVar4;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 PrimitiveRestartCase::getIndex (int indexNdx)
{
	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	return (deUint32)m_indicesUB[indexNdx];
		case INDEX_UNSIGNED_SHORT:	return (deUint32)m_indicesUS[indexNdx];
		case INDEX_UNSIGNED_INT:	return m_indicesUI[indexNdx];
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}